

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O3

int dwarf_get_loclist_c(Dwarf_Attribute attr,Dwarf_Loc_Head_c *ll_header_out,
                       Dwarf_Unsigned *listlen_out,Dwarf_Error *error)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  Dwarf_CU_Context pDVar4;
  ushort uVar5;
  int iVar6;
  Dwarf_Loc_Head_c llhead;
  int iVar7;
  Dwarf_Signed DVar8;
  uint val;
  ulong v;
  char *pcVar9;
  Dwarf_Debug dbg;
  char *attrname;
  char *formname;
  dwarfstring m;
  char *local_60;
  char *local_58;
  dwarfstring_s local_50;
  
  if (attr == (Dwarf_Attribute)0x0) {
    pcVar9 = "DW_DLE_ATTR_NULLNULL Dwarf_Attribute argument passed to dwarf_get_loclist_c()";
    DVar8 = 0x6f;
  }
  else {
    if ((attr->ar_dbg == (Dwarf_Debug)0x0) || (attr->ar_dbg->de_magic != 0xebfdebfd)) {
      pcVar9 = 
      "DW_DLE_DBG_NULL: dbg argument to dwarf_get_loclist_c()either null or it containsa stale Dwarf_Debug pointer"
      ;
    }
    else {
      local_50.s_data._0_2_ = 0;
      pDVar4 = attr->ar_cu_context;
      if (pDVar4 == (Dwarf_CU_Context)0x0) {
        DVar8 = 0x73;
        dbg = (Dwarf_Debug)0x0;
LAB_001b0d0b:
        _dwarf_error(dbg,error,DVar8);
        return 1;
      }
      dbg = pDVar4->cc_dbg;
      if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
        iVar6 = dwarf_whatform(attr,(Dwarf_Half *)&local_50,error);
        uVar5 = (ushort)local_50.s_data;
        if (iVar6 != 0) {
          return iVar6;
        }
        v = (ulong)(ushort)local_50.s_data;
        uVar2 = attr->ar_attribute;
        uVar3 = pDVar4->cc_version_stamp;
        bVar1 = pDVar4->cc_address_size;
        iVar6 = pDVar4->cc_is_dwo;
        iVar7 = 0;
        val = (uint)(ushort)local_50.s_data;
        if ((ushort)local_50.s_data < 9) {
          if ((1 < (ushort)local_50.s_data - 3) &&
             ((1 < (ushort)local_50.s_data - 6 || (iVar7 = 1, (uVar3 & 0xfffe) != 2)))) {
LAB_001b0e7a:
            local_58 = "<unknownform>";
            local_60 = "<unknown attribute>";
            dwarfstring_constructor(&local_50);
            dwarf_get_FORM_name(val,&local_58);
            dwarf_get_AT_name((uint)uVar2,&local_60);
            dwarfstring_append_printf_u
                      (&local_50,"DW_DLE_LOC_EXPR_BAD: For Compilation Unit version %u",(ulong)uVar3
                      );
            dwarfstring_append_printf_u(&local_50,", attribute 0x%x (",(ulong)uVar2);
            dwarfstring_append(&local_50,local_60);
            dwarfstring_append_printf_u(&local_50,") form 0x%x (",v);
            dwarfstring_append(&local_50,local_58);
            pcVar9 = ") (the CU is a .dwo) ";
            if (iVar6 == 0) {
              pcVar9 = ") (the CU is not a .dwo) ";
            }
            dwarfstring_append(&local_50,pcVar9);
            dwarfstring_append(&local_50," we don\'t understand the location");
            pcVar9 = dwarfstring_string(&local_50);
            _dwarf_error_string(dbg,error,0x80,pcVar9);
            dwarfstring_destructor(&local_50);
            return 1;
          }
        }
        else {
          iVar7 = 0;
          if ((ushort)local_50.s_data < 0x18) {
            if (1 < (ushort)local_50.s_data - 9) {
              if (val != 0x17) goto LAB_001b0e7a;
              iVar7 = 5;
              if (uVar3 != 5) {
                iVar7 = (iVar6 != 0 && uVar3 == 4) + 1;
              }
            }
          }
          else if ((val != 0x18) && ((val != 0x22 || (iVar7 = 5, uVar3 != 5)))) goto LAB_001b0e7a;
        }
        llhead = (Dwarf_Loc_Head_c)_dwarf_get_alloc(dbg,';',1);
        if (llhead == (Dwarf_Loc_Head_c)0x0) {
          DVar8 = 0x3e;
          goto LAB_001b0d0b;
        }
        llhead->ll_cuversion = uVar3;
        llhead->ll_lkind = (Dwarf_Half)iVar7;
        llhead->ll_attrnum = uVar2;
        llhead->ll_attrform = uVar5;
        llhead->ll_dbg = dbg;
        llhead->ll_address_size = (uint)bVar1;
        llhead->ll_offset_size = (uint)pDVar4->cc_length_size;
        llhead->ll_context = pDVar4;
        llhead->ll_magic = 0xadab4;
        llhead->ll_at_loclists_base_present = pDVar4->cc_loclists_base_present;
        llhead->ll_at_loclists_base = pDVar4->cc_loclists_base;
        llhead->ll_cu_base_address_present = pDVar4->cc_low_pc_present;
        llhead->ll_cu_base_address = pDVar4->cc_low_pc;
        llhead->ll_cu_addr_base = pDVar4->cc_addr_base;
        llhead->ll_cu_addr_base_present = pDVar4->cc_addr_base_present;
        if (iVar7 - 1U < 2) {
          iVar6 = _dwarf_original_loclist_build(dbg,llhead,attr,error);
          if (iVar6 != 0) goto LAB_001b0fed;
          if (iVar7 == 1) {
            iVar6 = cook_original_loclist_contents(dbg,llhead,error);
          }
          else {
            iVar6 = cook_gnu_loclist_contents(dbg,llhead,error);
          }
        }
        else if (iVar7 == 5) {
          iVar6 = _dwarf_loclists_fill_in_lle_head(dbg,attr,llhead,error);
          if (iVar6 != 0) goto LAB_001b0fed;
          iVar6 = cook_loclists_contents(dbg,llhead,error);
        }
        else {
          if (iVar7 != 0) goto LAB_001b0ff7;
          iVar6 = _dwarf_original_expression_build(dbg,llhead,attr,error);
        }
        if (iVar6 == 0) {
LAB_001b0ff7:
          *ll_header_out = llhead;
          *listlen_out = llhead->ll_locdesc_count;
          return 0;
        }
LAB_001b0fed:
        dwarf_dealloc_loc_head_c(llhead);
        return iVar6;
      }
      pcVar9 = 
      "DW_DLE_DBG_NULL: dbg argument to _dwarf_get_loclist_lle_count()either null or it containsa stale Dwarf_Debug pointer"
      ;
    }
    DVar8 = 0x51;
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,DVar8,pcVar9);
  return 1;
}

Assistant:

int
dwarf_get_loclist_c(Dwarf_Attribute attr,
    Dwarf_Loc_Head_c * ll_header_out,
    Dwarf_Unsigned   * listlen_out,
    Dwarf_Error      * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Half form          = 0;
    Dwarf_Loc_Head_c llhead  = 0;
    Dwarf_CU_Context cucontext = 0;
    unsigned address_size    = 0;
    Dwarf_Half cuversionstamp       = 0;
    Dwarf_Bool is_cu         = FALSE;
    Dwarf_Unsigned attrnum   = 0;
    Dwarf_Bool is_dwo        = 0;
    int setup_res            = DW_DLV_ERROR;
    int lkind                = 0;

    if (!attr) {
        _dwarf_error_string(dbg, error,DW_DLE_ATTR_NULL,
            "DW_DLE_ATTR_NULL"
            "NULL Dwarf_Attribute "
            "argument passed to "
            "dwarf_get_loclist_c()");
        return DW_DLV_ERROR;
    }
    dbg = attr->ar_dbg;
    CHECK_DBG(dbg,error,"dwarf_get_loclist_c()");

    /* ***** BEGIN CODE ***** */
    setup_res = _dwarf_setup_loc(attr, &dbg,&cucontext, &form, error);
    if (setup_res != DW_DLV_OK) {
        return setup_res;
    }
    attrnum = attr->ar_attribute;
    cuversionstamp = cucontext->cc_version_stamp;
    address_size = cucontext->cc_address_size;
    is_dwo = cucontext->cc_is_dwo;
    lkind = determine_location_lkind(cuversionstamp,
        form, is_dwo);
    if (lkind == DW_LKIND_unknown) {
        dwarfstring m;
        const char * formname = "<unknownform>";
        const char * attrname = "<unknown attribute>";

        dwarfstring_constructor(&m);
        dwarf_get_FORM_name((unsigned int)form,&formname);
        dwarf_get_AT_name((unsigned int)attrnum,&attrname);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_LOC_EXPR_BAD: For Compilation Unit "
            "version %u",cuversionstamp);
        dwarfstring_append_printf_u(&m,
            ", attribute 0x%x (",attrnum);
        dwarfstring_append(&m,(char *)attrname);
        dwarfstring_append_printf_u(&m,
            ") form 0x%x (",form);
        dwarfstring_append(&m,(char *)formname);
        if (is_dwo) {
            dwarfstring_append(&m,") (the CU is a .dwo) ");
        } else {
            dwarfstring_append(&m,") (the CU is not a .dwo) ");
        }
        dwarfstring_append(&m," we don't understand the location");
        _dwarf_error_string(dbg,error,DW_DLE_LOC_EXPR_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    /*  Doing this early (first) to avoid repeating the alloc code
        for each type  */
    llhead = (Dwarf_Loc_Head_c)
        _dwarf_get_alloc(dbg, DW_DLA_LOC_HEAD_C, 1);
    if (!llhead) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    llhead->ll_cuversion = cuversionstamp;
    llhead->ll_lkind = lkind;
    llhead->ll_attrnum = (Dwarf_Half)attrnum;
    llhead->ll_attrform = (Dwarf_Half)form;
    llhead->ll_dbg = dbg;
    llhead->ll_address_size = address_size;
    llhead->ll_offset_size = cucontext->cc_length_size;
    llhead->ll_context = cucontext;
    llhead->ll_magic = LOCLISTS_MAGIC;

    llhead->ll_at_loclists_base_present =
        cucontext->cc_loclists_base_present;
    llhead->ll_at_loclists_base =  cucontext->cc_loclists_base;
    llhead->ll_cu_base_address_present = cucontext->cc_low_pc_present;
    llhead->ll_cu_base_address = cucontext->cc_low_pc;
    llhead->ll_cu_addr_base = cucontext->cc_addr_base;
    llhead->ll_cu_addr_base_present =
        cucontext->cc_addr_base_present;

    if (lkind == DW_LKIND_loclist ||
        lkind == DW_LKIND_GNU_exp_list) {
        int ores = 0;
        /* Here we have a loclist to deal with. */
        ores = context_is_cu_not_tu(cucontext,&is_cu);
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return setup_res;
        }
        ores = _dwarf_original_loclist_build(dbg,
            llhead, attr, error);
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return ores;
        }
        if (lkind == DW_LKIND_loclist) {
            ores = cook_original_loclist_contents(dbg,llhead,
                error);
        } else {
            ores = cook_gnu_loclist_contents(dbg,llhead,error);
        }
        if (ores != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return ores;
        }
    } else if (lkind == DW_LKIND_expression) {
        /* DWARF2,3,4,5 */
        int eres = 0;
        eres = _dwarf_original_expression_build(dbg,
            llhead, attr, error);
        if (eres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return eres;
        }
    } else if (lkind == DW_LKIND_loclists) {
        /* DWARF5! */
        int leres = 0;

        leres = _dwarf_loclists_fill_in_lle_head(dbg,
            attr,llhead,error);
        if (leres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return leres;
        }
        leres = cook_loclists_contents(dbg,llhead,error);
        if (leres != DW_DLV_OK) {
            dwarf_dealloc_loc_head_c(llhead);
            return leres;
        }
    } /* ASSERT else impossible */
    *ll_header_out = llhead;
    *listlen_out = llhead->ll_locdesc_count;
    return DW_DLV_OK;
}